

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::appendUndoItem(QTextDocumentPrivate *this,QTextUndoCommand *c)

{
  QList<QTextUndoCommand> *this_00;
  byte bVar1;
  quint32 qVar2;
  QTextUndoCommand *pQVar3;
  byte bVar4;
  bool bVar5;
  pointer pQVar6;
  byte bVar7;
  long lVar8;
  long in_FS_OFFSET;
  QTextUndoCommand local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->undoEnabled != true) goto LAB_0045f9b0;
  if ((long)this->undoState < (this->undoStack).d.size) {
    clearUndoRedoStacks(this,RedoStack,false);
  }
  this_00 = &this->undoStack;
  if (((this->editBlock != 0) && (qVar2 = this->editBlockCursorPosition, -1 < (int)qVar2)) &&
     (c->pos != qVar2)) {
    local_48.command = 9;
    local_48._2_1_ = 1;
    local_48.operation = '\x01';
    local_48.format = 0;
    local_48.strPos = 0;
    local_48.field_8.custom = (QAbstractUndoItem *)0xaaaaaaaa00000000;
    local_48.revision = 0;
    local_48._28_4_ = 0xaaaaaaaa;
    local_48.pos = qVar2;
    QList<QTextUndoCommand>::emplaceBack<QTextUndoCommand_const&>(this_00,&local_48);
    this->undoState = this->undoState + 1;
    this->editBlockCursorPosition = -1;
  }
  if (((this->undoStack).d.size != 0) && (this->modified == true)) {
    lVar8 = (long)this->undoState + -1;
    pQVar3 = (this->undoStack).d.ptr;
    bVar1 = pQVar3[lVar8].field_0x2;
    bVar7 = c->field_0x2;
    if ((bVar1 & 1) == 0) {
      bVar4 = bVar7 & 1;
      bVar7 = 1;
      if (bVar4 != 0) {
LAB_0045f92f:
        if (((bVar1 & 1) == 0 || (bVar7 & 1) != 0) ||
            (pQVar3[lVar8].command != 0 || c->command != 0)) goto LAB_0045f965;
      }
    }
    else if (((bVar1 & 2) == 0 & bVar7) == 0) goto LAB_0045f92f;
    pQVar6 = QList<QTextUndoCommand>::data(this_00);
    bVar5 = QTextUndoCommand::tryMerge(pQVar6 + lVar8,c);
    if (bVar5) goto LAB_0045f9b0;
  }
LAB_0045f965:
  if (this->undoState < this->modifiedState) {
    this->modifiedState = -1;
  }
  QList<QTextUndoCommand>::emplaceBack<QTextUndoCommand_const&>(this_00,c);
  this->undoState = this->undoState + 1;
  emitUndoAvailable(this,true);
  emitRedoAvailable(this,false);
  if ((c->field_0x2 & 1) == 0) {
    QTextDocument::undoCommandAdded(*(QTextDocument **)&this->field_0x8);
  }
LAB_0045f9b0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::appendUndoItem(const QTextUndoCommand &c)
{
    PMDEBUG("appendUndoItem, command=%d enabled=%d", c.command, undoEnabled);
    if (!undoEnabled)
        return;
    if (undoState < undoStack.size())
        clearUndoRedoStacks(QTextDocument::RedoStack);

    if (editBlock != 0 && editBlockCursorPosition >= 0) { // we had a beginEditBlock() with a cursor position
        if (q20::cmp_not_equal(c.pos, editBlockCursorPosition)) { // and that cursor position is different from the command
            // generate a CursorMoved undo item
            QT_INIT_TEXTUNDOCOMMAND(cc, QTextUndoCommand::CursorMoved, true, QTextUndoCommand::MoveCursor,
                                    0, 0, editBlockCursorPosition, 0, 0);
            undoStack.append(cc);
            undoState++;
            editBlockCursorPosition = -1;
        }
    }


    if (!undoStack.isEmpty() && modified) {
        const int lastIdx = undoState - 1;
        const QTextUndoCommand &last = undoStack.at(lastIdx);

        if ( (last.block_part && c.block_part && !last.block_end) // part of the same block => can merge
            || (!c.block_part && !last.block_part) // two single undo items => can merge
            || (c.command == QTextUndoCommand::Inserted && last.command == c.command && (last.block_part && !c.block_part))) {
            // two sequential inserts that are not part of the same block => can merge
            if (undoStack[lastIdx].tryMerge(c))
                return;
        }
    }
    if (modifiedState > undoState)
        modifiedState = -1;
    undoStack.append(c);
    undoState++;
    emitUndoAvailable(true);
    emitRedoAvailable(false);

    if (!c.block_part)
        emit document()->undoCommandAdded();
}